

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::CoverageBinInitializerSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0xd6) {
    if ((kind != DefaultCoverageBinInitializer) && (kind != ExpressionCoverageBinInitializer)) {
      return false;
    }
  }
  else if (((kind != IdWithExprCoverageBinInitializer) && (kind != RangeCoverageBinInitializer)) &&
          (kind != TransListCoverageBinInitializer)) {
    return false;
  }
  return true;
}

Assistant:

bool CoverageBinInitializerSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultCoverageBinInitializer:
        case SyntaxKind::ExpressionCoverageBinInitializer:
        case SyntaxKind::IdWithExprCoverageBinInitializer:
        case SyntaxKind::RangeCoverageBinInitializer:
        case SyntaxKind::TransListCoverageBinInitializer:
            return true;
        default:
            return false;
    }
}